

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void wabt::anon_unknown_1::ResolveTypeName
               (Module *module,Type *type,Index index,
               unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *bindings)

{
  bool bVar1;
  Enum EVar2;
  Index IVar3;
  Type *this;
  pointer pvVar4;
  Type local_44;
  Index local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  _Stack_38;
  Index type_index;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  const_iterator name_iterator;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *bindings_local;
  Type *pTStack_18;
  Index index_local;
  Type *type_local;
  Module *module_local;
  
  name_iterator.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               )bindings;
  bindings_local._4_4_ = index;
  pTStack_18 = type;
  type_local = (Type *)module;
  EVar2 = Type::operator_cast_to_Enum(type);
  if ((EVar2 == Reference) && (IVar3 = Type::GetReferenceIndex(pTStack_18), IVar3 == 0xffffffff)) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(name_iterator.
                super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur,(key_type *)((long)&bindings_local + 4));
    _Stack_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::cend(name_iterator.
                super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur);
    bVar1 = std::__detail::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) {
      __assert_fail("name_iterator != bindings.cend()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x144,
                    "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                   );
    }
    this = type_local + 0x4b;
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_30);
    local_3c = BindingHash::FindIndex((BindingHash *)this,&pvVar4->second);
    if (local_3c == 0xffffffff) {
      __assert_fail("type_index != kInvalidIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x146,
                    "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                   );
    }
    Type::Type(&local_44,Reference,local_3c);
    *pTStack_18 = local_44;
  }
  return;
}

Assistant:

void ResolveTypeName(
    const Module& module,
    Type& type,
    Index index,
    const std::unordered_map<uint32_t, std::string>& bindings) {
  if (type != Type::Reference || type.GetReferenceIndex() != kInvalidIndex) {
    return;
  }

  const auto name_iterator = bindings.find(index);
  assert(name_iterator != bindings.cend());
  const auto type_index = module.type_bindings.FindIndex(name_iterator->second);
  assert(type_index != kInvalidIndex);
  type = Type(Type::Reference, type_index);
}